

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateConstinitInitializer
          (StringFieldGenerator *this,Printer *printer)

{
  ulong uVar1;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  if ((this->inlined_ & 1U) == 0) {
    FieldDescriptor::default_value_string_abi_cxx11_((this->super_FieldGenerator).descriptor_);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      Formatter::operator()<>((Formatter *)local_50,"$name$_(nullptr)");
    }
    else {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "$name$_(&::$proto_ns$::internal::fixed_address_empty_string)");
    }
  }
  else {
    Formatter::operator()<>((Formatter *)local_50,"$name$_(nullptr, false)");
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void StringFieldGenerator::GenerateConstinitInitializer(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (inlined_) {
    format("$name$_(nullptr, false)");
    return;
  }
  if (descriptor_->default_value_string().empty()) {
    format("$name$_(&::$proto_ns$::internal::fixed_address_empty_string)");
  } else {
    format("$name$_(nullptr)");
  }
}